

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PackedArray.c
# Opt level: O3

uint32_t PackedArray_computeBitsPerItem(uint32_t *in,uint32_t count)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  
  if (count != 0) {
    uVar3 = 0;
    uVar2 = 0;
    do {
      if (uVar2 < in[uVar3]) {
        uVar2 = in[uVar3];
      }
      uVar3 = uVar3 + 1;
    } while (count != uVar3);
    if (uVar2 != 0) {
      uVar1 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      return (uVar1 ^ 0xffffffe0) + 0x21;
    }
  }
  return 1;
}

Assistant:

uint32_t PackedArray_computeBitsPerItem(const uint32_t* in, uint32_t count)
{
  uint32_t i, in_max, bitsPerItem;

  in_max = 0;
  for (i = 0; i < count; ++i)
    in_max = in[i] > in_max ? in[i] : in_max;

  bitsPerItem = __PackedArray_highestBitSet(in_max) + 1;
  return bitsPerItem == 0 ? 1 : bitsPerItem;
}